

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase *
CreateArrayIndex(ExpressionContext *ctx,SynBase *source,ExprBase *value,
                ArrayView<ArgumentData> arguments)

{
  IntrusiveList<TypeHandle> *this;
  _func_int **pp_Var1;
  long lVar2;
  _func_int *p_Var3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ArgumentData *pAVar8;
  ExprBase *pEVar9;
  undefined4 extraout_var;
  TypeHandle *pTVar10;
  ExprGetAddress *pEVar11;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ExprBase *pEVar12;
  _func_int **pp_Var13;
  TypeRef *pTVar14;
  undefined4 extraout_var_06;
  SynBase *pSVar15;
  VariableData *pVVar16;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  ExprGetAddress *pEVar17;
  undefined4 extraout_var_09;
  TypeBase *pTVar18;
  undefined4 extraout_var_10;
  TypeBase *pTVar19;
  char *msg;
  uint i_1;
  ulong uVar20;
  uint i;
  long lVar21;
  bool bVar22;
  InplaceStr name;
  InplaceStr name_00;
  ArrayView<ArgumentData> arguments_00;
  ArrayView<ArgumentData> arguments_01;
  ArrayView<ArgumentData> arguments_local;
  TypePair typePair;
  SmallArray<ArgumentData,_4U> callArguments;
  ArgumentData local_60;
  VariableHandle *variable;
  undefined4 extraout_var_00;
  undefined4 extraout_var_05;
  
  arguments_local.data = arguments.data;
  uVar5 = arguments.count;
  uVar20 = arguments._8_8_ & 0xffffffff;
  arguments_local.count = uVar5;
  if ((((value != (ExprBase *)0x0) && (value->typeID == 8)) &&
      (pp_Var13 = value[1]._vptr_ExprBase, pp_Var13 != (_func_int **)0x0)) &&
     (uVar5 == 1 && *(int *)(pp_Var13 + 1) == 0x1b)) {
    pAVar8 = ArrayView<ArgumentData>::operator[](&arguments_local,0);
    pEVar9 = anon_unknown.dwarf_ff84f::EvaluateExpression(ctx,source,pAVar8->value);
    if ((pEVar9 == (ExprBase *)0x0) || (pEVar9->typeID != 6)) {
      msg = "ERROR: expression didn\'t evaluate to a constant number";
    }
    else {
      pp_Var1 = pEVar9[1]._vptr_ExprBase;
      if ((long)pp_Var1 < 0) {
        msg = "ERROR: argument index can\'t be negative";
      }
      else {
        if (pp_Var13[0xc] != (_func_int *)0x0) {
          this = (IntrusiveList<TypeHandle> *)(pp_Var13 + 0xc);
          uVar5 = IntrusiveList<TypeHandle>::size(this);
          if (pp_Var1 < (_func_int **)(ulong)uVar5) {
            iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
            pEVar12 = (ExprBase *)CONCAT44(extraout_var,iVar6);
            pTVar18 = ctx->typeTypeID;
            pTVar10 = IntrusiveList<TypeHandle>::operator[](this,*(uint *)&pEVar9[1]._vptr_ExprBase)
            ;
            pTVar19 = pTVar10->type;
            pEVar12->typeID = 8;
            pEVar12->source = source;
            pEVar12->type = pTVar18;
            pEVar12->next = (ExprBase *)0x0;
            pEVar12->listed = false;
            pEVar12->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3558;
            pEVar12[1]._vptr_ExprBase = (_func_int **)pTVar19;
            return pEVar12;
          }
          iVar6 = *(int *)(pp_Var13 + 3);
          p_Var3 = pp_Var13[2];
          uVar5 = IntrusiveList<TypeHandle>::size(this);
          anon_unknown.dwarf_ff84f::Stop
                    (ctx,source,"ERROR: function arguemnt set \'%.*s\' has only %d argument(s)",
                     (ulong)(uint)(iVar6 - (int)p_Var3),p_Var3,(ulong)uVar5);
        }
        msg = "ERROR: function argument set is empty";
      }
    }
    goto LAB_001cf9b5;
  }
  pTVar18 = value->type;
  pEVar11 = (ExprGetAddress *)value;
  if (pTVar18 == (TypeBase *)0x0) {
LAB_001cf358:
    if (value->typeID == 0x16) {
      value = (ExprBase *)value[1]._vptr_ExprBase;
    }
    else if (value->typeID == 0x22) {
      iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
      pTVar14 = ExpressionContext::GetReferenceType(ctx,value->type);
      iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
      variable = (VariableHandle *)CONCAT44(extraout_var_02,iVar7);
      pVVar16 = (VariableData *)value[1]._vptr_ExprBase;
      variable->source = value->source;
      variable->variable = pVVar16;
      variable->next = (VariableHandle *)0x0;
      variable->listed = false;
      ExprGetAddress::ExprGetAddress
                ((ExprGetAddress *)CONCAT44(extraout_var_01,iVar6),source,&pTVar14->super_TypeBase,
                 variable);
      value = (ExprBase *)CONCAT44(extraout_var_01,iVar6);
    }
    else if ((pTVar18 == (TypeBase *)0x0) || (pTVar18->typeID != 0x12)) {
      bVar22 = AssertValueExpression(ctx,source,value);
      if (!bVar22) {
        iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        pEVar9 = (ExprBase *)CONCAT44(extraout_var_09,iVar6);
        pTVar18 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
        iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
        pTVar19 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
        ExprError::ExprError((ExprError *)CONCAT44(extraout_var_10,iVar6),source,pTVar19);
        pEVar9->typeID = 0x1b;
        pEVar9->source = source;
        pEVar9->type = pTVar18;
        pEVar9->next = (ExprBase *)0x0;
        pEVar9->listed = false;
        pEVar9->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e39f0;
        pEVar9[1]._vptr_ExprBase = (_func_int **)value;
        *(ExprError **)&pEVar9[1].typeID = (ExprError *)CONCAT44(extraout_var_10,iVar6);
        return pEVar9;
      }
      pSVar15 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
      pVVar16 = anon_unknown.dwarf_ff84f::AllocateTemporary(ctx,pSVar15,value->type);
      pEVar9 = CreateVariableAccess(ctx,pSVar15,pVVar16,false);
      pEVar9 = CreateAssignment(ctx,pSVar15,pEVar9,value);
      iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      pEVar12 = (ExprBase *)CONCAT44(extraout_var_07,iVar6);
      pTVar18 = ctx->typeVoid;
      iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
      pp_Var13 = (_func_int **)CONCAT44(extraout_var_08,iVar6);
      *pp_Var13 = (_func_int *)0x0;
      pp_Var13[1] = (_func_int *)pVVar16;
      pp_Var13[2] = (_func_int *)0x0;
      *(undefined1 *)(pp_Var13 + 3) = 0;
      pEVar12->typeID = 0x1e;
      pEVar12->source = pSVar15;
      pEVar12->type = pTVar18;
      pEVar12->next = (ExprBase *)0x0;
      pEVar12->listed = false;
      pEVar12->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e34e8;
      pEVar12[1]._vptr_ExprBase = pp_Var13;
      *(ExprBase **)&pEVar12[1].typeID = pEVar9;
      pEVar9 = CreateVariableAccess(ctx,pSVar15,pVVar16,false);
      pEVar9 = CreateGetAddress(ctx,pSVar15,pEVar9);
      pEVar17 = (ExprGetAddress *)CreateSequence(ctx,source,pEVar12,pEVar9);
      value = (ExprBase *)pEVar17;
    }
  }
  else if (pTVar18->typeID != 0x14) {
    if (pTVar18->typeID != 0x12) goto LAB_001cf358;
    iVar6 = (*ctx->allocator->_vptr_Allocator[2])();
    pEVar11 = (ExprGetAddress *)CONCAT44(extraout_var_00,iVar6);
    pTVar18 = (TypeBase *)pTVar18[1]._vptr_TypeBase;
    (pEVar11->super_ExprBase).typeID = 0x16;
    (pEVar11->super_ExprBase).source = source;
    (pEVar11->super_ExprBase).type = pTVar18;
    (pEVar11->super_ExprBase).next = (ExprBase *)0x0;
    (pEVar11->super_ExprBase).listed = false;
    (pEVar11->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3520;
    pEVar11->variable = (VariableHandle *)value;
    if ((pTVar18 != (TypeBase *)0x0) && (pTVar18->typeID == 0x14)) {
      value = (ExprBase *)pEVar11;
    }
  }
  pTVar18 = (((ExprGetAddress *)value)->super_ExprBase).type;
  if (((pTVar18 == (TypeBase *)0x0) || (pTVar18->typeID != 0x12)) &&
     (pTVar18 = (pEVar11->super_ExprBase).type, pTVar18->typeID != 0x14)) goto LAB_001cf95b;
  bVar22 = uVar5 != 1;
  for (uVar5 = 0; uVar5 < (uint)uVar20; uVar5 = uVar5 + 1) {
    pAVar8 = ArrayView<ArgumentData>::operator[](&arguments_local,uVar5);
    bVar22 = (bool)(bVar22 | pAVar8->name != (SynIdentifier *)0x0);
    uVar20 = (ulong)arguments_local.count;
  }
  pTVar18 = (((ExprGetAddress *)value)->super_ExprBase).type;
  if ((uint)uVar20 == 0) {
    typePair.b = (TypeBase *)0x0;
  }
  else {
    pAVar8 = ArrayView<ArgumentData>::operator[](&arguments_local,0);
    typePair.b = pAVar8->type;
  }
  typePair.a = pTVar18;
  if ((bVar22) ||
     (bVar4 = SmallDenseSet<TypePair,_TypePairHasher,_32U>::contains
                        (&ctx->noIndexOperatorForTypePair,&typePair), !bVar4)) {
    SmallArray<ArgumentData,_4U>::SmallArray(&callArguments,ctx->allocator);
    local_60.source = (((ExprGetAddress *)value)->super_ExprBase).source;
    local_60.type = (((ExprGetAddress *)value)->super_ExprBase).type;
    local_60.isExplicit = false;
    local_60.name = (SynIdentifier *)0x0;
    local_60.valueFunction = (FunctionData *)0x0;
    local_60.value = value;
    SmallArray<ArgumentData,_4U>::push_back(&callArguments,&local_60);
    for (uVar5 = 0; uVar5 < arguments_local.count; uVar5 = uVar5 + 1) {
      pAVar8 = ArrayView<ArgumentData>::operator[](&arguments_local,uVar5);
      SmallArray<ArgumentData,_4U>::push_back(&callArguments,pAVar8);
    }
    name.end = "";
    name.begin = "[]";
    arguments_00._12_4_ = 0;
    arguments_00.data = callArguments.data;
    arguments_00.count = callArguments.count;
    pEVar9 = CreateFunctionCallByName(ctx,source,name,arguments_00,true,false,true);
    if (pEVar9 == (ExprBase *)0x0) {
      pSVar15 = (pEVar11->super_ExprBase).source;
      pTVar18 = (pEVar11->super_ExprBase).type;
      pAVar8 = SmallArray<ArgumentData,_4U>::operator[](&callArguments,0);
      pAVar8->source = pSVar15;
      pAVar8->isExplicit = false;
      pAVar8->name = (SynIdentifier *)0x0;
      pAVar8->type = pTVar18;
      pAVar8->value = &pEVar11->super_ExprBase;
      pAVar8->valueFunction = (FunctionData *)0x0;
      name_00.end = "";
      name_00.begin = "[]";
      arguments_01._12_4_ = 0;
      arguments_01.data = callArguments.data;
      arguments_01.count = callArguments.count;
      pEVar9 = CreateFunctionCallByName(ctx,source,name_00,arguments_01,(bool)~bVar22,false,true);
      if (pEVar9 != (ExprBase *)0x0) {
        pTVar18 = pEVar9->type;
        if ((pTVar18 == (TypeBase *)0x0) || (pTVar18->typeID != 0x12)) goto LAB_001cf63c;
        iVar6 = (*ctx->allocator->_vptr_Allocator[2])();
        pEVar12 = (ExprBase *)CONCAT44(extraout_var_04,iVar6);
        goto LAB_001cf606;
      }
      SmallDenseSet<TypePair,_TypePairHasher,_32U>::insert
                (&ctx->noIndexOperatorForTypePair,&typePair);
      bVar4 = true;
    }
    else {
      pTVar18 = pEVar9->type;
      if ((pTVar18 == (TypeBase *)0x0) || (pTVar18->typeID != 0x12)) {
LAB_001cf63c:
        bVar4 = false;
      }
      else {
        iVar6 = (*ctx->allocator->_vptr_Allocator[2])();
        pEVar12 = (ExprBase *)CONCAT44(extraout_var_03,iVar6);
LAB_001cf606:
        pTVar18 = (TypeBase *)pTVar18[1]._vptr_TypeBase;
        pEVar12->typeID = 0x16;
        pEVar12->source = source;
        pEVar12->type = pTVar18;
        pEVar12->next = (ExprBase *)0x0;
        pEVar12->listed = false;
        pEVar12->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3520;
        pEVar12[1]._vptr_ExprBase = (_func_int **)pEVar9;
        bVar4 = false;
        pEVar9 = pEVar12;
      }
    }
    SmallArray<ArgumentData,_4U>::~SmallArray(&callArguments);
    if (!bVar4) {
      return pEVar9;
    }
    if (bVar22) {
      msg = "ERROR: overloaded \'[]\' operator is not available";
      goto LAB_001cf9b5;
    }
  }
  pAVar8 = ArrayView<ArgumentData>::operator[](&arguments_local,0);
  pEVar9 = CreateCast(ctx,source,pAVar8->value,ctx->typeInt,false);
  pEVar12 = anon_unknown.dwarf_ff84f::EvaluateExpression(ctx,source,pEVar9);
  bVar22 = true;
  if ((pEVar12 == (ExprBase *)0x0) || (pEVar12->typeID != 6)) {
    pEVar12 = (ExprBase *)0x0;
  }
  else {
    if ((long)pEVar12[1]._vptr_ExprBase < 0) {
      msg = "ERROR: array index cannot be negative";
      goto LAB_001cf9b5;
    }
    bVar22 = false;
  }
  pTVar18 = (pEVar11->super_ExprBase).type;
  if (pTVar18 != (TypeBase *)0x0) {
    lVar21 = 0x88;
    if (pTVar18->typeID != 0x14) {
      if (pTVar18->typeID != 0x13) goto LAB_001cf95b;
      lVar21 = 0x60;
      if ((!bVar22) &&
         (lVar2._0_4_ = pTVar18[1].typeID, lVar2._4_4_ = pTVar18[1].nameHash,
         lVar2 <= (long)pEVar12[1]._vptr_ExprBase)) {
        msg = "ERROR: array index out of bounds";
LAB_001cf9b5:
        anon_unknown.dwarf_ff84f::Stop(ctx,source,msg);
      }
    }
    iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pp_Var13 = (_func_int **)CONCAT44(extraout_var_05,iVar6);
    pTVar14 = ExpressionContext::GetReferenceType
                        (ctx,*(TypeBase **)((long)&pTVar18->_vptr_TypeBase + lVar21));
    *(undefined4 *)(pp_Var13 + 1) = 0x1b;
    pp_Var13[2] = (_func_int *)source;
    pp_Var13[3] = (_func_int *)pTVar14;
    pp_Var13[4] = (_func_int *)0x0;
    *(undefined1 *)(pp_Var13 + 5) = 0;
    *pp_Var13 = (_func_int *)&PTR__ExprBase_003e39f0;
    pp_Var13[6] = (_func_int *)value;
    pp_Var13[7] = (_func_int *)pEVar9;
    iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    pEVar9 = (ExprBase *)CONCAT44(extraout_var_06,iVar6);
    pTVar18 = *(TypeBase **)((long)&pTVar18->_vptr_TypeBase + lVar21);
    pEVar9->typeID = 0x16;
    pEVar9->source = source;
    pEVar9->type = pTVar18;
    pEVar9->next = (ExprBase *)0x0;
    pEVar9->listed = false;
    pEVar9->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3520;
    pEVar9[1]._vptr_ExprBase = pp_Var13;
    return pEVar9;
  }
LAB_001cf95b:
  anon_unknown.dwarf_ff84f::Stop
            (ctx,source,"ERROR: type \'%.*s\' is not an array",
             (ulong)(uint)(*(int *)&(pTVar18->name).end - (int)(pTVar18->name).begin));
}

Assistant:

ExprBase* CreateArrayIndex(ExpressionContext &ctx, SynBase *source, ExprBase *value, ArrayView<ArgumentData> arguments)
{
	// Handle argument[x] expresion
	if(ExprTypeLiteral *type = getType<ExprTypeLiteral>(value))
	{
		if(TypeArgumentSet *argumentSet = getType<TypeArgumentSet>(type->value))
		{
			if(arguments.size() == 1)
			{
				if(ExprIntegerLiteral *number = getType<ExprIntegerLiteral>(EvaluateExpression(ctx, source, arguments[0].value)))
				{
					if(number->value < 0)
						Stop(ctx, source, "ERROR: argument index can't be negative");

					if(argumentSet->types.empty())
						Stop(ctx, source, "ERROR: function argument set is empty");

					if(number->value >= argumentSet->types.size())
						Stop(ctx, source, "ERROR: function arguemnt set '%.*s' has only %d argument(s)", FMT_ISTR(argumentSet->name), argumentSet->types.size());

					return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, argumentSet->types[unsigned(number->value)]->type);
				}
				else
				{
					Stop(ctx, source, "ERROR: expression didn't evaluate to a constant number");
				}
			}
		}
	}

	ExprBase* wrapped = value;

	if(TypeRef *refType = getType<TypeRef>(value->type))
	{
		value = new (ctx.get<ExprDereference>()) ExprDereference(source, refType->subType, value);

		if(isType<TypeUnsizedArray>(value->type))
			wrapped = value;
	}
	else if(isType<TypeUnsizedArray>(value->type))
	{
		wrapped = value; // Do not modify
	}
	else if(ExprVariableAccess *node = getType<ExprVariableAccess>(value))
	{
		wrapped = new (ctx.get<ExprGetAddress>()) ExprGetAddress(source, ctx.GetReferenceType(value->type), new (ctx.get<VariableHandle>()) VariableHandle(node->source, node->variable));
	}
	else if(ExprDereference *node = getType<ExprDereference>(value))
	{
		wrapped = node->value;
	}
	else if(!isType<TypeRef>(wrapped->type))
	{
		if(!AssertValueExpression(ctx, source, wrapped))
			return new (ctx.get<ExprArrayIndex>()) ExprArrayIndex(source, ctx.GetErrorType(), value, new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType()));

		SynBase *sourceInternal = ctx.MakeInternal(source);

		VariableData *storage = AllocateTemporary(ctx, sourceInternal, wrapped->type);

		ExprBase *assignment = CreateAssignment(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, storage, false), value);

		ExprBase *definition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(sourceInternal, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, storage), assignment);

		wrapped = CreateSequence(ctx, source, definition, CreateGetAddress(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, storage, false)));
	}

	if(isType<TypeRef>(wrapped->type) || isType<TypeUnsizedArray>(value->type))
	{
		bool findOverload = arguments.empty() || arguments.size() > 1;

		for(unsigned i = 0; i < arguments.size(); i++)
		{
			if(arguments[i].name)
				findOverload = true;
		}

		TypePair typePair(wrapped->type, arguments.empty() ? NULL : arguments[0].type);

		if(findOverload || !ctx.noIndexOperatorForTypePair.contains(typePair))
		{
			SmallArray<ArgumentData, 4> callArguments(ctx.allocator);
			callArguments.push_back(ArgumentData(wrapped->source, false, NULL, wrapped->type, wrapped));

			for(unsigned i = 0; i < arguments.size(); i++)
				callArguments.push_back(arguments[i]);

			if(ExprBase *result = CreateFunctionCallByName(ctx, source, InplaceStr("[]"), callArguments, true, false, true))
			{
				if(TypeRef *refType = getType<TypeRef>(result->type))
					return new (ctx.get<ExprDereference>()) ExprDereference(source, refType->subType, result);

				return result;
			}

			callArguments[0] = ArgumentData(value->source, false, NULL, value->type, value);

			if(ExprBase *result = CreateFunctionCallByName(ctx, source, InplaceStr("[]"), callArguments, !findOverload, false, true))
			{
				if(TypeRef *refType = getType<TypeRef>(result->type))
					return new (ctx.get<ExprDereference>()) ExprDereference(source, refType->subType, result);

				return result;
			}

			ctx.noIndexOperatorForTypePair.insert(typePair);
		}

		if(findOverload)
			Stop(ctx, source, "ERROR: overloaded '[]' operator is not available");

		ExprBase *index = CreateCast(ctx, source, arguments[0].value, ctx.typeInt, false);

		ExprIntegerLiteral *indexValue = getType<ExprIntegerLiteral>(EvaluateExpression(ctx, source, index));

		if(indexValue && indexValue->value < 0)
			Stop(ctx, source, "ERROR: array index cannot be negative");

		if(TypeArray *type = getType<TypeArray>(value->type))
		{
			if(indexValue && indexValue->value >= type->length)
				Stop(ctx, source, "ERROR: array index out of bounds");

			// Array index only shifts an address, so we are left with a reference to get value from
			ExprArrayIndex *shift = new (ctx.get<ExprArrayIndex>()) ExprArrayIndex(source, ctx.GetReferenceType(type->subType), wrapped, index);

			return new (ctx.get<ExprDereference>()) ExprDereference(source, type->subType, shift);
		}

		if(TypeUnsizedArray *type = getType<TypeUnsizedArray>(value->type))
		{
			// Array index only shifts an address, so we are left with a reference to get value from
			ExprArrayIndex *shift = new (ctx.get<ExprArrayIndex>()) ExprArrayIndex(source, ctx.GetReferenceType(type->subType), wrapped, index);

			return new (ctx.get<ExprDereference>()) ExprDereference(source, type->subType, shift);
		}
	}

	Stop(ctx, source, "ERROR: type '%.*s' is not an array", FMT_ISTR(value->type->name));

	return NULL;
}